

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.cc
# Opt level: O1

Path * __thiscall tinyusdz::Path::get_parent_prim_path(Path *__return_storage_ptr__,Path *this)

{
  bool bVar1;
  long lVar2;
  string local_68;
  string local_48;
  
  if (this->_valid == false) {
LAB_00126ae4:
    (__return_storage_ptr__->_prim_part)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->_prim_part).field_2;
    (__return_storage_ptr__->_prim_part)._M_string_length = 0;
    (__return_storage_ptr__->_prim_part).field_2._M_local_buf[0] = '\0';
    (__return_storage_ptr__->_prop_part)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->_prop_part).field_2;
    (__return_storage_ptr__->_prop_part)._M_string_length = 0;
    (__return_storage_ptr__->_prop_part).field_2._M_local_buf[0] = '\0';
    (__return_storage_ptr__->_variant_part)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->_variant_part).field_2;
    (__return_storage_ptr__->_variant_part)._M_string_length = 0;
    (__return_storage_ptr__->_variant_part).field_2._M_local_buf[0] = '\0';
    (__return_storage_ptr__->_variant_selection_part)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->_variant_selection_part).field_2;
    (__return_storage_ptr__->_variant_selection_part)._M_string_length = 0;
    (__return_storage_ptr__->_variant_selection_part).field_2._M_local_buf[0] = '\0';
    (__return_storage_ptr__->_variant_part_str)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->_variant_part_str).field_2;
    (__return_storage_ptr__->_variant_part_str)._M_string_length = 0;
    (__return_storage_ptr__->_variant_part_str).field_2._M_local_buf[0] = '\0';
    (__return_storage_ptr__->_element)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->_element).field_2;
    (__return_storage_ptr__->_element)._M_string_length = 0;
    (__return_storage_ptr__->_element).field_2._M_local_buf[0] = '\0';
    (__return_storage_ptr__->_path_type).has_value_ = false;
    (__return_storage_ptr__->_path_type).contained = (storage_t<tinyusdz::Path::PathType>)0x0;
    __return_storage_ptr__->_valid = false;
    return __return_storage_ptr__;
  }
  bVar1 = is_root_prim(this);
  if (bVar1) {
    Path(__return_storage_ptr__,this);
    return __return_storage_ptr__;
  }
  if (((this->_prim_part)._M_string_length == 0) || ((this->_prop_part)._M_string_length == 0)) {
    lVar2 = std::__cxx11::string::rfind((char)this,0x2f);
    if (lVar2 != 0) {
      if (lVar2 == -1) goto LAB_00126ae4;
      std::__cxx11::string::substr((ulong)&local_68,(ulong)this);
      local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"");
      Path(__return_storage_ptr__,&local_68,&local_48);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p == &local_68.field_2) {
        return __return_storage_ptr__;
      }
      goto LAB_00126bed;
    }
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"/","");
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"");
    Path(__return_storage_ptr__,&local_68,&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"");
    Path(__return_storage_ptr__,&this->_prim_part,&local_68);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p == &local_68.field_2) {
    return __return_storage_ptr__;
  }
LAB_00126bed:
  operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  return __return_storage_ptr__;
}

Assistant:

Path Path::get_parent_prim_path() const {
  if (!_valid) {
    return Path();
  }

  if (is_root_prim()) {
    return *this;
  }

  if (is_prim_property_path()) {
    // return prim part
    return Path(prim_part(), "");
  }

  size_t n = _prim_part.find_last_of('/');
  if (n == std::string::npos) {
    // this should never happen though.
    return Path();
  }

  if (n == 0) {
    // return root
    return Path("/", "");
  }

  return Path(_prim_part.substr(0, n), "");
}